

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::SetArchive3dmVersion(ON_BinaryArchive *this,int v)

{
  int iVar1;
  bool local_15;
  bool rc;
  int v_local;
  ON_BinaryArchive *this_local;
  
  local_15 = false;
  if ((v < 1) || (5 < v)) {
    if ((0x31 < v) && (v % 10 == 0)) {
      iVar1 = CurrentArchiveVersion();
      if (v <= iVar1) goto LAB_0049cbf2;
    }
    this->m_3dm_version = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x41cc,"","ON_BinaryArchive::SetArchive3dmVersion - invalid version");
  }
  else {
LAB_0049cbf2:
    this->m_3dm_version = v;
    local_15 = true;
  }
  return local_15;
}

Assistant:

bool
ON_BinaryArchive::SetArchive3dmVersion(int v)
{
  bool rc = false;
  // valid versions are 1,2,3,4,5,50,60,70,...
  // 1 - 4 correspond to Rhino V1 - V4.
  // 5 was used for early V5 betas with 4 byte chunk lengths
  // 50 is used for V5 files with 8 bytes chunk lengths.
  // 60, 70, ... will be used for Rhino V6, V7, etc.
  if ( (v >= 1 && v <= 5) || ( v >= 50 && 0 == (v % 10) && v <= ON_BinaryArchive::CurrentArchiveVersion() ) )
  {
    m_3dm_version = v;
    rc = true;
  }
  else 
  {
    m_3dm_version = 0;
    ON_ERROR("ON_BinaryArchive::SetArchive3dmVersion - invalid version");
  }
  return rc;
}